

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerBreakpointManager.cxx
# Opt level: O3

size_t __thiscall
cmDebugger::cmDebuggerBreakpointManager::GetBreakpointCount(cmDebuggerBreakpointManager *this)

{
  _Hash_node_base *p_Var1;
  size_t sVar2;
  
  sVar2 = 0;
  for (p_Var1 = (this->Breakpoints)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    sVar2 = sVar2 + ((long)p_Var1[6]._M_nxt - (long)p_Var1[5]._M_nxt >> 3) * -0x5555555555555555;
  }
  return sVar2;
}

Assistant:

size_t cmDebuggerBreakpointManager::GetBreakpointCount() const
{
  size_t count = 0;
  for (auto const& pair : Breakpoints) {
    count += pair.second.size();
  }
  return count;
}